

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeContextEvictImage
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_handle_t hImage)

{
  ze_pfnContextEvictImage_t pfnEvictImage;
  ze_result_t result;
  ze_image_handle_t hImage_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnEvictImage._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c308 != (code *)0x0) {
    pfnEvictImage._4_4_ = (*DAT_0011c308)(hContext,hDevice,hImage);
  }
  return pfnEvictImage._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextEvictImage(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_image_handle_t hImage                        ///< [in] handle of image to make evict
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEvictImage = context.zeDdiTable.Context.pfnEvictImage;
        if( nullptr != pfnEvictImage )
        {
            result = pfnEvictImage( hContext, hDevice, hImage );
        }
        else
        {
            // generic implementation
        }

        return result;
    }